

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O3

Expression * __thiscall duckdb::BoundLimitNode::GetValueExpression(BoundLimitNode *this)

{
  type pEVar1;
  InternalException *this_00;
  string local_40;
  
  if (this->type == EXPRESSION_VALUE) {
    pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&this->expression);
    return pEVar1;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "BoundLimitNode::GetValueExpression called but limit is not an expression value","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const Expression &BoundLimitNode::GetValueExpression() const {
	if (Type() != LimitNodeType::EXPRESSION_VALUE) {
		throw InternalException("BoundLimitNode::GetValueExpression called but limit is not an expression value");
	}
	return *expression;
}